

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O2

Span * __thiscall SpanList::newSpan(SpanList *this,SpanMap *spanMap)

{
  int sc;
  key_type sa;
  Span *this_00;
  mapped_type *ppSVar1;
  key_type local_30;
  
  sa = (key_type)mmap((void *)0x0,(long)spanInfo[this->spanClass][2],3,0x21,0,0);
  this_00 = (Span *)operator_new(0x40);
  sc = this->spanClass;
  Span::Span(this_00,sa,spanInfo[sc][2],spanInfo[sc][3],0,sc,spanInfo[sc][1]);
  local_30 = sa;
  ppSVar1 = std::
            map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
            ::operator[](spanMap,&local_30);
  *ppSVar1 = this_00;
  this_00->prev = this_00;
  this_00->next = this_00;
  return this_00;
}

Assistant:

Span *SpanList::newSpan(SpanMap *spanMap) {
  // 没有 span了, 则调用mmap分配一个
  auto addr =
      mmap(NULL,                   //分配的首地址
           spanInfo[spanClass][2], //分配内存大小(必须是页的整数倍, 32位1页=4k)
           PROT_READ | PROT_WRITE, //映射区域保护权限：读|写
           MAP_ANON | MAP_SHARED, //匿名映射(不涉及文件io), 后面两个参数忽略
           0,                     //要映射到内存中的文件描述符
           0 //文件映射的偏移量，通常设置为0，必须是页的整数倍
      );
  // ! 产生 span的地方, 需要添加到 spanMap结构中
  Span *span = new Span(addr, spanInfo[spanClass][2], spanInfo[spanClass][3], 0,
                        spanClass, spanInfo[spanClass][1]);
  (*spanMap)[(bool *)addr] = span;
  span->prev = span;
  span->next = span;
  return span;
}